

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void execute_ppu(ppu_regs *ppu_regs,line_status *status,uint16_t scanline,uint16_t dot)

{
  _Bool _Var1;
  byte bVar2;
  uint8_t uVar3;
  uint16_t VRAM_address_00;
  uint16_t VRAM_address;
  uint16_t dot_local;
  uint16_t scanline_local;
  line_status *status_local;
  ppu_regs *ppu_regs_local;
  
  VRAM_address_00 = get_VRAM_address();
  if (((status->visable_line & 1U) != 0) && ((status->visable_dot & 1U) != 0)) {
    render_pixel(&execute_ppu::background_regs,scanline,dot);
  }
  if ((((status->render_line & 1U) != 0) && ((status->shift_reload_dot_range & 1U) != 0)) &&
     ((status->shift_reload_dot & 1U) != 0)) {
    reload_shift_registers
              (&execute_ppu::background_regs,&execute_ppu::fetched_bytes,VRAM_address_00);
  }
  if (((status->render_line & 1U) != 0) && ((status->visable_dot & 1U) != 0)) {
    fetch_shift_register_byte(&execute_ppu::fetched_bytes,ppu_regs,VRAM_address_00,dot);
  }
  _Var1 = should_shift_shift_registers(dot);
  if (_Var1) {
    shift_registers(&execute_ppu::background_regs);
  }
  if ((status->render_line & 1U) != 0) {
    _Var1 = is_secondary_OAM_clear_dot();
    if (_Var1) {
      secondary_OAM_clear(dot);
    }
    _Var1 = is_sprite_evuluation_dot();
    if ((_Var1) && ((status->visable_line & 1U) != 0)) {
      uVar3 = get_sprite_size(ppu_regs);
      sprite_evaluation(scanline,dot,uVar3);
    }
    if ((0x100 < dot) && (0x13f < dot)) {
      set_OAM_address('\0');
    }
    _Var1 = is_sprite_load_dot();
    if (_Var1) {
      bVar2 = get_8x8_address(ppu_regs);
      uVar3 = get_sprite_size(ppu_regs);
      do_sprite_load(scanline,dot,(ushort)bVar2,uVar3);
    }
    if (dot == 0x100) {
      incrementY();
    }
    if ((((status->visable_dot & 1U) != 0) || ((status->next_screen_dot & 1U) != 0)) &&
       ((uint)dot % 8 == 0)) {
      incrementX();
    }
    if (dot == 0x101) {
      copyX();
    }
    if ((((status->prerender_line & 1U) != 0) && (0x117 < dot)) && (dot < 0x131)) {
      copyY();
    }
    if (((status->prerender_line & 1U) != 0) && (dot == 0x42)) {
      clear_sprite0();
    }
    if (((status->prerender_line & 1U) != 0) && (dot == 1)) {
      clear_sprite_zero_hit();
      clear_sprite_overflow();
    }
  }
  return;
}

Assistant:

static void execute_ppu(
    ppu_regs* ppu_regs,
    line_status* status,
    uint16_t scanline,
    uint16_t dot
) {
    static BG_shift_registers background_regs = {0, 0, 0, 0, 0, 0};
    static fetched_BG_bytes fetched_bytes = {0, 0, 0, 0};
    uint16_t VRAM_address = get_VRAM_address();

    if(status->visable_line && status->visable_dot)
        render_pixel(&background_regs, scanline, dot);

    if(status->render_line && status->shift_reload_dot_range && status->shift_reload_dot)
        reload_shift_registers(&background_regs, &fetched_bytes, VRAM_address);

    if(status->render_line && status->visable_dot)
        fetch_shift_register_byte(&fetched_bytes, ppu_regs, VRAM_address, dot);

    if(should_shift_shift_registers(dot))
        shift_registers(&background_regs);

    if(status->render_line) {
        if( is_secondary_OAM_clear_dot() )
            secondary_OAM_clear(dot);
        if( is_sprite_evuluation_dot() && status->visable_line)
            sprite_evaluation(scanline, dot, get_sprite_size(ppu_regs));
        if( (dot >= 257) && (dot >= 320) )
            set_OAM_address(0);
        if( is_sprite_load_dot() )
            do_sprite_load(scanline, dot,
                           get_8x8_address(ppu_regs),
                           get_sprite_size(ppu_regs));

        if(dot == 256)
            incrementY();
        if( (status->visable_dot || status->next_screen_dot) && ((dot % 8) == 0) )
            incrementX();
        if(dot == 257)
            copyX();
        if( status->prerender_line && (dot >= 280) && (dot <= 304) )
            copyY();
        if( status->prerender_line && (dot == 66) )
            clear_sprite0();
        if( status->prerender_line && (dot == 1) ) {
            clear_sprite_zero_hit();
            clear_sprite_overflow();
        }
    }
}